

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

bool __thiscall
QJsonValueConstRef::concreteBool(QJsonValueConstRef *this,QJsonValueConstRef self,bool defaultValue)

{
  int iVar1;
  undefined1 uVar2;
  
  uVar2 = self._8_1_;
  iVar1 = (int)(&((this->field_0).a[6].a.d.ptr)->usedData)
               [((ulong)self.field_0.a >> (~self.field_0._0_1_ & 1)) * 2];
  if (iVar1 != 0x114) {
    if (iVar1 == 0x115) {
      uVar2 = 1;
    }
    return (bool)uVar2;
  }
  return false;
}

Assistant:

bool QJsonValueConstRef::concreteBool(QJsonValueConstRef self, bool defaultValue) noexcept
{
    auto &e = QJsonPrivate::Value::elementHelper(self);
    if (e.type == QCborValue::False)
        return false;
    if (e.type == QCborValue::True)
        return true;
    return defaultValue;
}